

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payment.cpp
# Opt level: O2

void handlePostJointResponse(json *receivedObject,char *tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference this;
  int iVar4;
  string strId;
  string stringTag;
  string_t local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stringTag,tag,(allocator<char> *)&strId);
  std::__cxx11::string::substr((ulong)&strId,(ulong)&stringTag);
  iVar4 = 10;
  iVar2 = std::__cxx11::stoi(&strId,(size_t *)0x0,10);
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)receivedObject,"response");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_38,this,-1,' ',false,strict);
  std::__cxx11::string::~string((string *)&local_38);
  if (local_38._M_dataplus._M_p == (char *)0x0) goto LAB_001bec87;
  iVar3 = strcmp(local_38._M_dataplus._M_p,"accepted");
  if (iVar3 == 0) {
    if (_cbPaymentResult != (cbPaymentResult)0x0) {
      iVar4 = 9;
LAB_001bec73:
      (*_cbPaymentResult)(iVar2,iVar4,(char *)0x2e5798);
    }
  }
  else {
    bVar1 = std::type_info::operator==
                      ((type_info *)
                       &nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::typeinfo,
                       (type_info *)
                       &nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::typeinfo);
    if (!bVar1) goto LAB_001bec87;
    if (_cbPaymentResult != (cbPaymentResult)0x0) goto LAB_001bec73;
  }
  bufferPayment.isFree = true;
LAB_001bec87:
  std::__cxx11::string::~string((string *)&strId);
  std::__cxx11::string::~string((string *)&stringTag);
  return;
}

Assistant:

void handlePostJointResponse(nlohmann::json receivedObject, const char * tag){
	std::string stringTag = tag;
	std::string strId = stringTag.substr(10);
	int id = stoi(strId);
	const char * response = receivedObject["response"].dump().c_str();
	if (response != nullptr){
		if (strcmp(response, "accepted") == 0){
			if(_cbPaymentResult){
				_cbPaymentResult(id, PAYMENT_ACKNOWLEDGED, bufferPayment.unit);
			}
			bufferPayment.isFree = true;
		} else {
			if (typeid(receivedObject["error"]) == typeid(nlohmann::json)){
				if(_cbPaymentResult){
					_cbPaymentResult(id, PAYMENT_REFUSED, bufferPayment.unit);
				}
				bufferPayment.isFree = true;
			}
		}
	} 
}